

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::(anonymous_namespace)::TwoWayPipeEnd> __thiscall
kj::
heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncPipe> *params,
          Own<kj::(anonymous_namespace)::AsyncPipe> *params_1)

{
  AsyncPipe *pAVar1;
  AsyncPipe *pAVar2;
  undefined8 *puVar3;
  TwoWayPipeEnd *extraout_RDX;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> OVar4;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_40;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_30;
  
  puVar3 = (undefined8 *)operator_new(0x38);
  local_30.disposer = params->disposer;
  pAVar1 = params->ptr;
  params->ptr = (AsyncPipe *)0x0;
  local_40.disposer = params_1->disposer;
  pAVar2 = params_1->ptr;
  params_1->ptr = (AsyncPipe *)0x0;
  *puVar3 = &PTR_read_0067a570;
  local_30.ptr = (AsyncPipe *)0x0;
  puVar3[1] = &PTR_write_0067a5f0;
  puVar3[4] = local_40.disposer;
  puVar3[5] = pAVar2;
  puVar3[2] = local_30.disposer;
  puVar3[3] = pAVar1;
  local_40.ptr = (AsyncPipe *)0x0;
  UnwindDetector::UnwindDetector((UnwindDetector *)(puVar3 + 6));
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd>::instance;
  *(undefined8 **)(this + 8) = puVar3;
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_40);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_30);
  OVar4.ptr = extraout_RDX;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}